

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

LY_ERR lys_compile_identity_bases
                 (lysc_ctx *ctx,lysp_module *base_pmod,char **bases_p,lysc_ident *ident,
                 lysc_ident ***bases)

{
  int iVar1;
  LY_ERR LVar2;
  char *pcVar3;
  char *local_a8;
  char *local_98;
  char *local_88;
  undefined8 *local_80;
  char *p___1;
  char *p__;
  lysc_ident **pplStack_68;
  LY_ERR ret__;
  lysc_ident **idref;
  lys_module *mod;
  char *name;
  char *s;
  uint64_t v;
  uint64_t u;
  lysc_ident ***bases_local;
  lysc_ident *ident_local;
  char **bases_p_local;
  lysp_module *base_pmod_local;
  lysc_ctx *ctx_local;
  
  if ((ident == (lysc_ident *)0x0) && (bases == (lysc_ident ***)0x0)) {
    __assert_fail("ident || bases",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0x14c,
                  "LY_ERR lys_compile_identity_bases(struct lysc_ctx *, const struct lysp_module *, const char **, struct lysc_ident *, struct lysc_ident ***)"
                 );
  }
  if (bases_p == (char **)0x0) {
    local_88 = (char *)0x0;
  }
  else {
    local_88 = bases_p[-1];
  }
  if (((char *)0x1 < local_88) && (ctx->pmod->version < 2)) {
    pcVar3 = "identityref type";
    if (ident != (lysc_ident *)0x0) {
      pcVar3 = "identity";
    }
    ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
            "Multiple bases in %s are allowed only in YANG 1.1 modules.",pcVar3);
    return LY_EVALID;
  }
  v = 0;
  do {
    if (bases_p == (char **)0x0) {
      local_98 = (char *)0x0;
    }
    else {
      local_98 = bases_p[-1];
    }
    if (local_98 <= v) {
      return LY_SUCCESS;
    }
    pcVar3 = strchr(bases_p[v],0x3a);
    if (pcVar3 == (char *)0x0) {
      mod = (lys_module *)bases_p[v];
      idref = (lysc_ident **)base_pmod->mod;
    }
    else {
      mod = (lys_module *)(pcVar3 + 1);
      idref = (lysc_ident **)
              ly_resolve_prefix(ctx->ctx,bases_p[v],(long)pcVar3 - (long)bases_p[v],LY_VALUE_SCHEMA,
                                base_pmod);
    }
    if (idref == (lysc_ident **)0x0) {
      if (ident == (lysc_ident *)0x0) {
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid prefix used for base (%s) of identityref.",bases_p[v]);
      }
      else {
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                "Invalid prefix used for base (%s) of identity \"%s\".",bases_p[v],ident->name);
      }
      return LY_EVALID;
    }
    pplStack_68 = (lysc_ident **)0x0;
    s = (char *)0x0;
    while( true ) {
      if (idref[0xc] == (lysc_ident *)0x0) {
        local_a8 = (char *)0x0;
      }
      else {
        local_a8 = *(char **)&idref[0xc][-1].flags;
      }
      if (local_a8 <= s) goto LAB_001621b4;
      iVar1 = strcmp((char *)mod,idref[0xc][(long)s].name);
      if (iVar1 == 0) break;
      s = s + 1;
    }
    if (ident == (lysc_ident *)0x0) {
      if (*bases == (lysc_ident **)0x0) {
        local_80 = (undefined8 *)malloc(0x10);
        if (local_80 == (undefined8 *)0x0) {
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_identity_bases");
          return LY_EMEM;
        }
        *local_80 = 1;
      }
      else {
        (*bases)[-1] = (lysc_ident *)((long)&(*bases)[-1]->name + 1);
        local_80 = (undefined8 *)realloc(*bases + -1,(long)(*bases)[-1] * 8 + 8);
        if (local_80 == (undefined8 *)0x0) {
          (*bases)[-1] = (lysc_ident *)&(*bases)[-1][-1].field_0x37;
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_identity_bases");
          return LY_EMEM;
        }
      }
      *bases = (lysc_ident **)(local_80 + 1);
      pplStack_68 = *bases + (long)&(*bases)[-1][-1].field_0x37;
      memset(pplStack_68,0,8);
      *pplStack_68 = idref[0xc] + (long)s;
    }
    else {
      if (ident == idref[0xc] + (long)s) {
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,"Identity \"%s\" is derived from itself.",
                ident->name);
        return LY_EVALID;
      }
      LVar2 = lys_compile_identity_circular_check(ctx,idref[0xc] + (long)s,ident->derived);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (idref[0xc][(long)s].derived == (lysc_ident **)0x0) {
        p___1 = (char *)malloc(0x10);
        if (p___1 == (char *)0x0) {
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_identity_bases");
          return LY_EMEM;
        }
        p___1[0] = '\x01';
        p___1[1] = '\0';
        p___1[2] = '\0';
        p___1[3] = '\0';
        p___1[4] = '\0';
        p___1[5] = '\0';
        p___1[6] = '\0';
        p___1[7] = '\0';
      }
      else {
        idref[0xc][(long)s].derived[-1] =
             (lysc_ident *)((long)&idref[0xc][(long)s].derived[-1]->name + 1);
        p___1 = (char *)realloc(idref[0xc][(long)s].derived + -1,
                                (long)idref[0xc][(long)s].derived[-1] * 8 + 8);
        if (p___1 == (char *)0x0) {
          idref[0xc][(long)s].derived[-1] =
               (lysc_ident *)&idref[0xc][(long)s].derived[-1][-1].field_0x37;
          ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "lys_compile_identity_bases");
          return LY_EMEM;
        }
      }
      idref[0xc][(long)s].derived = (lysc_ident **)(p___1 + 8);
      pplStack_68 = idref[0xc][(long)s].derived +
                    (long)&idref[0xc][(long)s].derived[-1][-1].field_0x37;
      memset(pplStack_68,0,8);
      *pplStack_68 = ident;
    }
LAB_001621b4:
    if (pplStack_68 == (lysc_ident **)0x0) {
      if (ident == (lysc_ident *)0x0) {
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,"Unable to find base (%s) of identityref.",
                bases_p[v]);
      }
      else {
        ly_vlog(ctx->ctx,(char *)0x0,LYVE_SYNTAX_YANG,"Unable to find base (%s) of identity \"%s\"."
                ,bases_p[v],ident->name);
      }
      return LY_EVALID;
    }
    v = v + 1;
  } while( true );
}

Assistant:

LY_ERR
lys_compile_identity_bases(struct lysc_ctx *ctx, const struct lysp_module *base_pmod, const char **bases_p,
        struct lysc_ident *ident, struct lysc_ident ***bases)
{
    LY_ARRAY_COUNT_TYPE u, v;
    const char *s, *name;
    const struct lys_module *mod;
    struct lysc_ident **idref;

    assert(ident || bases);

    if ((LY_ARRAY_COUNT(bases_p) > 1) && (ctx->pmod->version < LYS_VERSION_1_1)) {
        LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                "Multiple bases in %s are allowed only in YANG 1.1 modules.", ident ? "identity" : "identityref type");
        return LY_EVALID;
    }

    LY_ARRAY_FOR(bases_p, u) {
        s = strchr(bases_p[u], ':');
        if (s) {
            /* prefixed identity */
            name = &s[1];
            mod = ly_resolve_prefix(ctx->ctx, bases_p[u], s - bases_p[u], LY_VALUE_SCHEMA, (void *)base_pmod);
        } else {
            name = bases_p[u];
            mod = base_pmod->mod;
        }
        if (!mod) {
            if (ident) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid prefix used for base (%s) of identity \"%s\".", bases_p[u], ident->name);
            } else {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Invalid prefix used for base (%s) of identityref.", bases_p[u]);
            }
            return LY_EVALID;
        }

        idref = NULL;
        LY_ARRAY_FOR(mod->identities, v) {
            if (!strcmp(name, mod->identities[v].name)) {
                if (ident) {
                    if (ident == &mod->identities[v]) {
                        LOGVAL(ctx->ctx, LYVE_REFERENCE,
                                "Identity \"%s\" is derived from itself.", ident->name);
                        return LY_EVALID;
                    }
                    LY_CHECK_RET(lys_compile_identity_circular_check(ctx, &mod->identities[v], ident->derived));
                    /* we have match! store the backlink */
                    LY_ARRAY_NEW_RET(ctx->ctx, mod->identities[v].derived, idref, LY_EMEM);
                    *idref = ident;
                } else {
                    /* we have match! store the found identity */
                    LY_ARRAY_NEW_RET(ctx->ctx, *bases, idref, LY_EMEM);
                    *idref = &mod->identities[v];
                }
                break;
            }
        }
        if (!idref) {
            if (ident) {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Unable to find base (%s) of identity \"%s\".", bases_p[u], ident->name);
            } else {
                LOGVAL(ctx->ctx, LYVE_SYNTAX_YANG,
                        "Unable to find base (%s) of identityref.", bases_p[u]);
            }
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}